

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

bool __thiscall
ON_MorphControl::GetBBox(ON_MorphControl *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  int iVar1;
  bool local_22;
  bool rc;
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_MorphControl *this_local;
  
  local_22 = false;
  iVar1 = this->m_varient;
  if (iVar1 == 1) {
    local_22 = ON_NurbsCurve::GetBBox(&this->m_nurbs_curve,boxmin,boxmax,bGrowBox);
  }
  else if (iVar1 == 2) {
    local_22 = ON_NurbsSurface::GetBBox(&this->m_nurbs_surface,boxmin,boxmax,bGrowBox);
  }
  else if (iVar1 == 3) {
    local_22 = ON_NurbsCage::GetBBox(&this->m_nurbs_cage,boxmin,boxmax,bGrowBox);
  }
  return local_22;
}

Assistant:

bool ON_MorphControl::GetBBox(
        double* boxmin,
        double* boxmax,
        bool bGrowBox
        ) const
{
  bool rc = false;
  switch(m_varient)
  {
  case 1:
    rc = m_nurbs_curve.GetBBox(boxmin,boxmax,bGrowBox);
    break;
  case 2:
    rc = m_nurbs_surface.GetBBox(boxmin,boxmax,bGrowBox);
    break;
  case 3:
    rc = m_nurbs_cage.GetBBox(boxmin,boxmax,bGrowBox);
    break;
  }
  return rc;
}